

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::BaseModeFunction<duckdb::ModeString>::
     Combine<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *source,
               ModeState<duckdb::string_t,_duckdb::ModeString> *target,AggregateInputData *param_3)

{
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *pOVar1;
  mapped_type *pmVar2;
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *this;
  _Hash_node_base _Var3;
  __node_base *p_Var4;
  
  pOVar1 = source->frequency_map;
  if (pOVar1 != (OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                 *)0x0) {
    if (target->frequency_map == (Counts *)0x0) {
      this = (OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
              *)operator_new(0x48);
      OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
      ::OwningStringMap(this,pOVar1);
      target->frequency_map = this;
      target->count = source->count;
    }
    else {
      p_Var4 = &(pOVar1->map)._M_h._M_before_begin;
      while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
        pmVar2 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                 ::operator[](target->frequency_map,(key_type *)(p_Var4 + 1));
        pmVar2->count = (long)&(p_Var4[3]._M_nxt)->_M_nxt + pmVar2->count;
        _Var3._M_nxt = p_Var4[4]._M_nxt;
        if ((_Hash_node_base *)pmVar2->first_row < p_Var4[4]._M_nxt) {
          _Var3._M_nxt = (_Hash_node_base *)pmVar2->first_row;
        }
        pmVar2->first_row = (idx_t)_Var3._M_nxt;
      }
      target->count = target->count + source->count;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.frequency_map) {
			return;
		}
		if (!target.frequency_map) {
			// Copy - don't destroy! Otherwise windowing will break.
			target.frequency_map = new typename STATE::Counts(*source.frequency_map);
			target.count = source.count;
			return;
		}
		for (auto &val : *source.frequency_map) {
			auto &i = (*target.frequency_map)[val.first];
			i.count += val.second.count;
			i.first_row = MinValue(i.first_row, val.second.first_row);
		}
		target.count += source.count;
	}